

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O3

bool __thiscall ipx::Basis::TightenLuPivotTol(Basis *this)

{
  ostream *poVar1;
  double dVar2;
  stringstream h_logging_stream;
  undefined1 *local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8 [16];
  stringstream local_198 [16];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  dVar2 = LuUpdate::pivottol((this->lu_)._M_t.
                             super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>
                             .super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl);
  if (dVar2 <= 0.05) {
    dVar2 = 0.1;
  }
  else if (dVar2 <= 0.25) {
    dVar2 = 0.3;
  }
  else {
    if (0.5 < dVar2) {
      return false;
    }
    dVar2 = 0.9;
  }
  LuUpdate::pivottol((this->lu_)._M_t.
                     super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
                     super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
                     super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl,dVar2);
  std::__cxx11::stringstream::stringstream(local_198);
  local_1b0 = 0;
  local_1a8[0] = 0;
  local_1b8 = local_1a8;
  std::__cxx11::stringbuf::str((string *)(local_188 + 8));
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188," LU pivot tolerance tightened to ",0x21);
  dVar2 = LuUpdate::pivottol((this->lu_)._M_t.
                             super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>
                             .super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  local_1b8 = (undefined1 *)CONCAT71(local_1b8._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1b8,1);
  Control::hLog(this->control_,(stringstream *)local_198);
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return true;
}

Assistant:

bool Basis::TightenLuPivotTol() {
    double tol = lu_->pivottol();
    if (tol <= 0.05)
        lu_->pivottol(0.1);
    else if (tol <= 0.25)
        lu_->pivottol(0.3);
    else if (tol <= 0.5)
        lu_->pivottol(0.9);
    else
        return false;
    std::stringstream h_logging_stream;
    h_logging_stream.str(std::string());
    h_logging_stream << " LU pivot tolerance tightened to " << lu_->pivottol() << '\n';
    control_.hLog(h_logging_stream);
    return true;
}